

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcmEvents.c
# Opt level: O2

int XcmeContext_Setup2(XcmeContext_s *c,char *display_name,int flags)

{
  Display *pDVar1;
  undefined8 uVar2;
  int iVar3;
  Display *pDVar4;
  Window WVar5;
  Atom AVar6;
  undefined8 uVar7;
  char *pcVar8;
  undefined4 in_register_00000014;
  int format;
  unsigned_long left;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  uchar *data;
  unsigned_long n;
  Atom actual;
  XSetWindowAttributes attrs;
  
  XSetErrorHandler(XcmeErrorHandler,display_name,CONCAT44(in_register_00000014,flags));
  pDVar1 = c->display;
  pDVar4 = pDVar1;
  if (pDVar1 == (Display *)0x0) {
    pDVar4 = (Display *)XOpenDisplay(display_name);
    c->display = pDVar4;
    c->display_is_owned = 1;
    if (pDVar4 == (Display *)0x0) {
      pcVar8 = "???";
      if (display_name != (char *)0x0) {
        pcVar8 = display_name;
      }
      (*XcmMessage_p)(XCME_MSG_DISPLAY_ERROR,(void *)0x0,"could not open display %s",pcVar8);
      return 1;
    }
  }
  c->screen = *(int *)(pDVar4 + 0xe0);
  WVar5 = XRootWindow();
  c->root = WVar5;
  AVar6 = XInternAtom(c->display,"_ICC_COLOR_PROFILES",0);
  c->aProfile = AVar6;
  AVar6 = XInternAtom(c->display,"_ICC_COLOR_OUTPUTS",0);
  c->aOutputs = AVar6;
  AVar6 = XInternAtom(c->display,"_ICC_COLOR_MANAGEMENT",0);
  c->aCM = AVar6;
  AVar6 = XInternAtom(c->display,"_ICC_COLOR_REGIONS",0);
  c->aRegion = AVar6;
  AVar6 = XInternAtom(c->display,"_ICC_COLOR_DESKTOP",0);
  c->aDesktop = AVar6;
  AVar6 = XInternAtom(c->display,"_ICC_COLOR_DISPLAY_ADVANCED",0);
  c->aAdvanced = AVar6;
  AVar6 = XInternAtom(c->display,"_NET_DESKTOP_GEOMETRY",0);
  c->aNetDesktopGeometry = AVar6;
  if (pDVar1 == (Display *)0x0) {
    left._0_4_ = 0x105321;
    left._4_4_ = 0;
    uStack_e0 = 0;
    uStack_dc = 0;
    attrs.colormap =
         XCreateColormap(c->display,c->root,
                         *(undefined8 *)
                          (*(long *)(c->display + 0xe8) + 0x40 + (long)c->screen * 0x80),0);
    attrs.border_pixel = 0;
    attrs.event_mask = 0x428001;
    WVar5 = XCreateWindow(c->display,c->root,0,0,300,300,5,0x18,1,
                          *(undefined8 *)
                           (*(long *)(c->display + 0xe8) + 0x40 + (long)c->screen * 0x80),0x2808,
                          &attrs);
    c->w = WVar5;
    iVar3 = XStringListToTextProperty(&left,1,&actual);
    if (iVar3 != 0) {
      XSetWMName(c->display,c->w,&actual);
    }
  }
  pDVar1 = c->display;
  uVar2 = *(undefined8 *)(*(long *)(pDVar1 + 0xe8) + 0x10);
  uVar7 = XInternAtom(pDVar1,"_NET_CLIENT_LIST",0);
  XGetWindowProperty(pDVar1,uVar2,uVar7,0,0xffffffffffffffff,0,0x21,&actual,&format,&n,&left,&data);
  if (data == (uchar *)0x0 || n == 0) {
    pcVar8 = "zero";
    if (n != 0) {
      pcVar8 = "missed";
    }
    (*XcmMessage_p)(XCME_MSG_DISPLAY_ERROR,(void *)0x0,
                    "\nThe extented ICCCM hint _NET_CLIENT_LIST atom is %s\n!!! xcmevents will work limited !!!\n"
                    ,pcVar8);
  }
  XSelectInput(c->display,c->root,0x408000);
  XcmeSelectInput(c);
  return 0;
}

Assistant:

int      XcmeContext_Setup2          ( XcmeContext_s     * c,
                                       const char        * display_name,
                                       int                 flags XCM_UNUSED )
{
  /* Open the display and create our window. */
  Visual * vis = 0;
  Colormap cmap = 0;
  XSetWindowAttributes attrs;
  Atom actual;
  int format,
      has_display = 0;
  unsigned long left, n;
  unsigned char * data;

  XSetErrorHandler( XcmeErrorHandler );

  if(c->display)
    has_display = 1;
  else
  {
    c->display = XOpenDisplay( display_name );
    c->display_is_owned = 1;
  }
  if(!c->display)
  {
    DERR( "could not open display %s", display_name?display_name:"???" );
    return 1;
  }

  c->screen = DefaultScreen( c->display );
  c->root = XRootWindow( c->display, c->screen );

  /* define the observers interesst */
  c->aProfile = XInternAtom( c->display, XCM_COLOR_PROFILES, False );
  c->aOutputs = XInternAtom( c->display, XCM_COLOR_OUTPUTS, False );
  c->aCM = XInternAtom( c->display, "_ICC_COLOR_MANAGEMENT", False );
  c->aRegion = XInternAtom( c->display, XCM_COLOR_REGIONS, False );
  c->aDesktop = XInternAtom( c->display, XCM_COLOR_DESKTOP, False );
  c->aAdvanced = XInternAtom(c->display, XCM_COLOUR_DESKTOP_ADVANCED,False);
  c->aNetDesktopGeometry = XInternAtom( c->display, "_NET_DESKTOP_GEOMETRY", False );

  if(!has_display)
  {
    char * strings[] = {"XcmEvents",NULL};
    XTextProperty text;

    vis = DefaultVisual( c->display, c->screen );
    cmap = XCreateColormap( c->display, c->root, vis, AllocNone );
    attrs.colormap = cmap;
    attrs.border_pixel = 0;
    attrs.event_mask = StructureNotifyMask | ExposureMask | KeyPressMask |
                       PropertyChangeMask;

    c->w = XCreateWindow( c->display, c->root, 0, 0, 300, 300, 5, 24,
                          InputOutput, DefaultVisual( c->display, c->screen ),
                          CWBorderPixel | CWColormap | CWEventMask, &attrs);

    if(XStringListToTextProperty( strings, 1, &text))
      XSetWMName( c->display, c->w, &text );
    /*XMapWindow( display, w );*/
  }

  /* check if we can see other clients */
  XGetWindowProperty( c->display, RootWindow(c->display,0),
                      XInternAtom(c->display, "_NET_CLIENT_LIST", False),
                      0, ~0, False, XA_WINDOW,
                      &actual,&format, &n, &left, &data );
  if(!data || !n)
    DERR( "\nThe extented ICCCM hint _NET_CLIENT_LIST atom is %s\n"
          "!!! xcmevents will work limited !!!\n", n ? "missed" : "zero" );

  /* observe the root window as well for newly appearing windows */
  XSelectInput( c->display, c->root,
                PropertyChangeMask |   /* _ICC_COLOR_PROFILES */
                ExposureMask );        /* _ICC_COLOR_MANAGEMENT */

  /* observe windows */
  XcmeSelectInput( c );

  return 0;
}